

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O1

void multikey_cache<8u,false>(Cacheblock<8U>_conflict *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  ulong uVar5;
  int iVar6;
  uint64_t uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  Cacheblock<8U>_conflict *pCVar12;
  Cacheblock<8U>_conflict *pCVar13;
  ulong uVar14;
  Cacheblock<8U>_conflict *pCVar15;
  byte bVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  Cacheblock<8U>_conflict *pCVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  byte bVar26;
  ulong uVar27;
  ulong uVar28;
  Cacheblock<8U>_conflict __tmp;
  
  if (N < 0x20) {
    if (N != 0) {
      if (1 < (long)N) {
        uVar21 = N & 0xffffffff;
        pCVar12 = cache;
        do {
          uVar22 = pCVar12[1].cached_bytes;
          puVar3 = pCVar12[1].ptr;
          pCVar12 = pCVar12 + 1;
          pCVar13 = pCVar12;
          while ((cache < pCVar13 && (uVar22 < pCVar13[-1].cached_bytes))) {
            puVar4 = pCVar13[-1].ptr;
            pCVar13->cached_bytes = pCVar13[-1].cached_bytes;
            pCVar13->ptr = puVar4;
            pCVar13 = pCVar13 + -1;
          }
          iVar6 = (int)uVar21;
          pCVar13->cached_bytes = uVar22;
          pCVar13->ptr = puVar3;
          uVar21 = (ulong)(iVar6 - 1);
        } while (2 < iVar6);
      }
      if (N == 1) {
        lVar23 = 0;
        uVar21 = 1;
      }
      else {
        lVar25 = 0;
        lVar18 = 0;
        uVar22 = 1;
        do {
          lVar19 = lVar18 + 1;
          if (cache[lVar18].cached_bytes == cache[lVar19].cached_bytes) {
            uVar21 = uVar22 + 1;
            lVar23 = lVar25;
          }
          else {
            uVar21 = 1;
            lVar23 = lVar19;
            if ((1 < uVar22) && (1 < (int)uVar22 && (char)cache[lVar25].cached_bytes != '\0')) {
              pCVar12 = cache + lVar25;
              do {
                puVar3 = pCVar12[1].ptr;
                pCVar12 = pCVar12 + 1;
                for (pCVar13 = pCVar12; cache + lVar25 < pCVar13; pCVar13 = pCVar13 + -1) {
                  puVar4 = pCVar13[-1].ptr;
                  bVar16 = puVar4[depth + 8];
                  bVar26 = puVar3[depth + 8];
                  if ((bVar16 != 0) && (lVar18 = depth + 9, bVar16 == bVar26)) {
                    do {
                      bVar16 = puVar4[lVar18];
                      bVar26 = puVar3[lVar18];
                      if (bVar16 == 0) break;
                      lVar18 = lVar18 + 1;
                    } while (bVar16 == bVar26);
                  }
                  if (bVar16 <= bVar26) break;
                  pCVar13->ptr = puVar4;
                }
                iVar6 = (int)uVar22;
                pCVar13->ptr = puVar3;
                uVar22 = (ulong)(iVar6 - 1);
              } while (2 < iVar6);
            }
          }
          lVar25 = lVar23;
          lVar18 = lVar19;
          uVar22 = uVar21;
        } while (lVar19 != N - 1);
      }
      if (((1 < uVar21) && ((char)cache[lVar23].cached_bytes != '\0')) && (1 < (int)uVar21)) {
        pCVar12 = cache + lVar23;
        do {
          puVar3 = pCVar12[1].ptr;
          pCVar12 = pCVar12 + 1;
          for (pCVar13 = pCVar12; cache + lVar23 < pCVar13; pCVar13 = pCVar13 + -1) {
            puVar4 = pCVar13[-1].ptr;
            bVar16 = puVar4[depth + 8];
            bVar26 = puVar3[depth + 8];
            if ((bVar16 != 0) && (lVar25 = depth + 9, bVar16 == bVar26)) {
              do {
                bVar16 = puVar4[lVar25];
                bVar26 = puVar3[lVar25];
                if (bVar16 == 0) break;
                lVar25 = lVar25 + 1;
              } while (bVar16 == bVar26);
            }
            if (bVar16 <= bVar26) break;
            pCVar13->ptr = puVar4;
          }
          iVar6 = (int)uVar21;
          pCVar13->ptr = puVar3;
          uVar21 = (ulong)(iVar6 - 1);
        } while (2 < iVar6);
      }
    }
    return;
  }
  uVar11 = N >> 3;
  uVar21 = cache->cached_bytes;
  uVar22 = cache[uVar11].cached_bytes;
  pCVar12 = cache;
  if (uVar21 != uVar22) {
    pCVar12 = cache + (N >> 2);
    uVar24 = pCVar12->cached_bytes;
    if ((uVar24 != uVar21) && (uVar24 != uVar22)) {
      if (uVar21 < uVar22) {
        if (uVar24 <= uVar21) {
          pCVar12 = cache;
        }
        if (uVar22 < uVar24) {
          pCVar12 = cache + uVar11;
        }
      }
      else {
        if (uVar21 < uVar24) {
          pCVar12 = cache;
        }
        if (uVar24 < uVar22) {
          pCVar12 = cache + uVar11;
        }
      }
    }
  }
  uVar24 = N >> 1;
  pCVar13 = cache + (uVar24 - uVar11);
  uVar21 = cache[uVar24 - uVar11].cached_bytes;
  uVar22 = cache[uVar24].cached_bytes;
  pCVar15 = pCVar13;
  if (uVar21 != uVar22) {
    pCVar20 = cache + uVar24;
    pCVar15 = pCVar20 + uVar11;
    uVar24 = pCVar15->cached_bytes;
    if ((uVar24 != uVar21) && (uVar24 != uVar22)) {
      if (uVar21 < uVar22) {
        if (uVar21 < uVar24) {
          pCVar13 = pCVar15;
        }
        pCVar15 = pCVar13;
        if (uVar22 < uVar24) {
          pCVar15 = pCVar20;
        }
      }
      else {
        if (uVar21 < uVar24) {
          pCVar15 = pCVar13;
        }
        if (uVar24 < uVar22) {
          pCVar15 = pCVar20;
        }
      }
    }
  }
  lVar25 = (N - (N >> 2)) + -1;
  pCVar13 = cache + lVar25;
  lVar23 = (N - uVar11) + -1;
  uVar21 = cache[lVar25].cached_bytes;
  uVar22 = cache[lVar23].cached_bytes;
  pCVar20 = pCVar13;
  if (uVar21 != uVar22) {
    pCVar20 = cache + (N - 3);
    uVar11 = pCVar20->cached_bytes;
    if ((uVar11 != uVar21) && (uVar11 != uVar22)) {
      if (uVar21 < uVar22) {
        if (uVar21 < uVar11) {
          pCVar13 = pCVar20;
        }
        pCVar20 = pCVar13;
        if (uVar22 < uVar11) {
          pCVar20 = cache + lVar23;
        }
      }
      else {
        if (uVar21 < uVar11) {
          pCVar20 = pCVar13;
        }
        if (uVar11 < uVar22) {
          pCVar20 = cache + lVar23;
        }
      }
    }
  }
  uVar21 = pCVar12->cached_bytes;
  uVar22 = pCVar15->cached_bytes;
  pCVar13 = pCVar12;
  if (((uVar21 != uVar22) && (uVar11 = pCVar20->cached_bytes, pCVar13 = pCVar20, uVar11 != uVar21))
     && (uVar11 != uVar22)) {
    if (uVar21 < uVar22) {
      if (uVar21 < uVar11) {
        pCVar12 = pCVar20;
      }
      pCVar13 = pCVar12;
      if (uVar22 < uVar11) {
        pCVar13 = pCVar15;
      }
    }
    else {
      if (uVar21 < uVar11) {
        pCVar20 = pCVar12;
      }
      pCVar13 = pCVar20;
      if (uVar11 < uVar22) {
        pCVar13 = pCVar15;
      }
    }
  }
  uVar17 = N - 1;
  uVar7 = cache->cached_bytes;
  puVar3 = cache->ptr;
  puVar4 = pCVar13->ptr;
  cache->cached_bytes = pCVar13->cached_bytes;
  cache->ptr = puVar4;
  pCVar13->cached_bytes = uVar7;
  pCVar13->ptr = puVar3;
  uVar22 = cache->cached_bytes;
  uVar14 = 1;
  uVar11 = uVar17;
  uVar21 = uVar17;
  uVar24 = 1;
LAB_00225070:
  uVar27 = uVar21;
  if (uVar14 <= uVar11) goto code_r0x00225075;
  goto LAB_002250b8;
code_r0x00225075:
  pCVar12 = cache + uVar14;
  uVar5 = cache[uVar14].cached_bytes;
  uVar28 = uVar24;
  if (uVar22 > uVar5 || uVar5 == uVar22) {
    if (uVar22 <= uVar5) {
      uVar28 = uVar24 + 1;
      uVar7 = cache[uVar24].cached_bytes;
      puVar3 = cache[uVar24].ptr;
      puVar4 = pCVar12->ptr;
      cache[uVar24].cached_bytes = pCVar12->cached_bytes;
      cache[uVar24].ptr = puVar4;
      pCVar12->cached_bytes = uVar7;
      pCVar12->ptr = puVar3;
    }
    uVar14 = uVar14 + 1;
  }
  uVar24 = uVar28;
  if (uVar22 < uVar5) {
LAB_002250b8:
    do {
      uVar21 = uVar27;
      if (uVar11 < uVar14) break;
      pCVar12 = cache + uVar11;
      uVar28 = cache[uVar11].cached_bytes;
      if (uVar22 <= uVar28) {
        if (uVar28 == uVar22) {
          uVar21 = uVar27 - 1;
          uVar7 = cache[uVar27].cached_bytes;
          puVar3 = cache[uVar27].ptr;
          puVar4 = pCVar12->ptr;
          cache[uVar27].cached_bytes = pCVar12->cached_bytes;
          cache[uVar27].ptr = puVar4;
          pCVar12->cached_bytes = uVar7;
          pCVar12->ptr = puVar3;
        }
        uVar11 = uVar11 - 1;
      }
      uVar27 = uVar21;
    } while (uVar22 <= uVar28);
    if (uVar11 < uVar14) {
      uVar17 = uVar17 - uVar21;
      uVar27 = uVar14 - uVar24;
      uVar21 = uVar21 - uVar11;
      uVar11 = uVar24;
      if (uVar27 < uVar24) {
        uVar11 = uVar27;
      }
      if (uVar11 != 0) {
        lVar23 = 0;
        do {
          puVar1 = (undefined8 *)((long)&cache->cached_bytes + lVar23);
          uVar8 = *puVar1;
          uVar9 = puVar1[1];
          puVar1 = (undefined8 *)((long)&cache[uVar14 - uVar11].cached_bytes + lVar23);
          uVar10 = puVar1[1];
          puVar2 = (undefined8 *)((long)&cache->cached_bytes + lVar23);
          *puVar2 = *puVar1;
          puVar2[1] = uVar10;
          puVar1 = (undefined8 *)((long)&cache[uVar14 - uVar11].cached_bytes + lVar23);
          *puVar1 = uVar8;
          puVar1[1] = uVar9;
          lVar23 = lVar23 + 0x10;
        } while (uVar11 * 0x10 != lVar23);
      }
      uVar11 = uVar17;
      if (uVar21 < uVar17) {
        uVar11 = uVar21;
      }
      if (uVar11 != 0) {
        lVar23 = 0;
        do {
          puVar1 = (undefined8 *)((long)&cache[uVar14].cached_bytes + lVar23);
          uVar8 = *puVar1;
          uVar9 = puVar1[1];
          puVar1 = (undefined8 *)((long)&cache[N - uVar11].cached_bytes + lVar23);
          uVar10 = puVar1[1];
          puVar2 = (undefined8 *)((long)&cache[uVar14].cached_bytes + lVar23);
          *puVar2 = *puVar1;
          puVar2[1] = uVar10;
          puVar1 = (undefined8 *)((long)&cache[N - uVar11].cached_bytes + lVar23);
          *puVar1 = uVar8;
          puVar1[1] = uVar9;
          lVar23 = lVar23 + 0x10;
        } while (uVar11 * 0x10 != lVar23);
      }
      multikey_cache<8u,false>(cache,uVar27,depth);
      multikey_cache<8u,false>(cache + uVar27 + uVar24 + uVar17,uVar21,depth);
      if ((char)uVar22 == '\0') {
        return;
      }
      multikey_cache<8u,true>(cache + uVar27,uVar24 + uVar17,depth + 8);
      return;
    }
    uVar7 = cache[uVar14].cached_bytes;
    puVar3 = cache[uVar14].ptr;
    puVar4 = cache[uVar11].ptr;
    cache[uVar14].cached_bytes = cache[uVar11].cached_bytes;
    cache[uVar14].ptr = puVar4;
    cache[uVar11].cached_bytes = uVar7;
    cache[uVar11].ptr = puVar3;
    uVar14 = uVar14 + 1;
    uVar11 = uVar11 - 1;
  }
  goto LAB_00225070;
}

Assistant:

static void
multikey_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	if (N < 32) {
		if (N==0) return;
		if (CacheDirty) {
			insertion_sort(cache, N, depth);
			return;
		}
		inssort_cache_block(cache, N);
		size_t start=0, cnt=1;
		for (size_t i=0; i < N-1; ++i) {
			if (Cmp()(cache[i], cache[i+1]) == 0) {
				++cnt;
				continue;
			}
			if (cnt > 1 and cache[start].cached_bytes & 0xFF)
				insertion_sort(cache+start, cnt,
						depth+CachedChars);
			cnt = 1;
			start = i+1;
		}
		if (cnt > 1 and cache[start].cached_bytes & 0xFF)
			insertion_sort(cache+start, cnt, depth+CachedChars);
		return;
	}
	if (CacheDirty) {
		fill_cache(cache, N, depth);
	}
	// Move pivot to first position to avoid wrapping the unsigned values
	// we are using in the main loop from zero to max.
	std::swap(cache[0], med3char(
		med3char(cache[0],       cache[N/8],     cache[N/4],    Cmp()),
		med3char(cache[N/2-N/8], cache[N/2],     cache[N/2+N/8],Cmp()),
		med3char(cache[N-1-N/4], cache[N-1-N/8], cache[N-3],    Cmp()),
		Cmp()));
	Cacheblock<CachedChars> partval = cache[0];
	size_t first   = 1;
	size_t last    = N-1;
	size_t beg_ins = 1;
	size_t end_ins = N-1;
	while (true) {
		while (first <= last) {
			const int res = Cmp()(cache[first], partval);
			if (res > 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[beg_ins++], cache[first]);
			}
			++first;
		}
		while (first <= last) {
			const int res = Cmp()(cache[last], partval);
			if (res < 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[end_ins--], cache[last]);
			}
			--last;
		}
		if (first > last)
			break;
		std::swap(cache[first], cache[last]);
		++first;
		--last;
	}
	// Some calculations to make the code more readable.
	const size_t num_eq_beg = beg_ins;
	const size_t num_eq_end = N-1-end_ins;
	const size_t num_eq     = num_eq_beg+num_eq_end;
	const size_t num_lt     = first-beg_ins;
	const size_t num_gt     = end_ins-last;
	// Swap the equal pointers from the beginning to proper position.
	const size_t size1 = std::min(num_eq_beg, num_lt);
	std::swap_ranges(cache, cache+size1, cache+first-size1);
	// Swap the equal pointers from the end to proper position.
	const size_t size2 = std::min(num_eq_end, num_gt);
	std::swap_ranges(cache+first, cache+first+size2, cache+N-size2);
	// Now recurse.
	multikey_cache<CachedChars, false>(cache, num_lt, depth);
	multikey_cache<CachedChars, false>(cache+num_lt+num_eq, num_gt, depth);
	if (partval.cached_bytes & 0xFF)
		multikey_cache<CachedChars, true>(
			cache+num_lt, num_eq, depth+CachedChars);
}